

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_wipe.cpp
# Opt level: O0

void wipe_EndScreen(void)

{
  undefined1 auVar1 [16];
  DFrameBuffer *pDVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  if (CurrentWipeType != 0) {
    iVar3 = DCanvas::GetWidth((DCanvas *)screen);
    iVar4 = DCanvas::GetHeight((DCanvas *)screen);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)((iVar3 * iVar4) / 2);
    uVar7 = SUB168(auVar1 * ZEXT816(2),0);
    if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    wipe_scr_end = (short *)operator_new__(uVar7);
    pDVar2 = screen;
    uVar5 = DCanvas::GetWidth((DCanvas *)screen);
    uVar6 = DCanvas::GetHeight((DCanvas *)screen);
    (*(pDVar2->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xc])
              (pDVar2,0,0,(ulong)uVar5,(ulong)uVar6,wipe_scr_end);
    pDVar2 = screen;
    uVar5 = DCanvas::GetWidth((DCanvas *)screen);
    uVar6 = DCanvas::GetHeight((DCanvas *)screen);
    (*(pDVar2->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xb])
              (pDVar2,0,0,(ulong)uVar5,(ulong)uVar6,wipe_scr_start);
    (*wipes[(CurrentWipeType + -1) * 3])(0);
  }
  return;
}

Assistant:

void wipe_EndScreen (void)
{
	if (CurrentWipeType)
	{
		wipe_scr_end = new short[SCREENWIDTH * SCREENHEIGHT / 2];
		screen->GetBlock (0, 0, SCREENWIDTH, SCREENHEIGHT, (BYTE *)wipe_scr_end);
		screen->DrawBlock (0, 0, SCREENWIDTH, SCREENHEIGHT, (BYTE *)wipe_scr_start); // restore start scr.
		// Initialize the wipe
		(*wipes[(CurrentWipeType-1)*3])(0);
	}
}